

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_append2_op(sexp ctx,sexp self,sexp_sint_t n,sexp a,sexp b)

{
  sexp_sint_t extraout_RDX;
  sexp_sint_t n_00;
  sexp_sint_t extraout_RDX_00;
  sexp self_00;
  sexp local_40;
  sexp local_38;
  sexp *local_30;
  sexp_gc_var_t *local_28;
  sexp *local_20;
  undefined8 local_18;
  
  local_30 = &local_38;
  local_38 = (sexp)0x43e;
  local_18 = &local_30;
  local_28 = (ctx->value).context.saves;
  local_20 = &local_40;
  self_00 = (sexp)&local_20;
  (ctx->value).context.saves = (sexp_gc_var_t *)self_00;
  local_40 = b;
  local_38 = sexp_reverse_op(ctx,self_00,(sexp_sint_t)local_20,a);
  n_00 = extraout_RDX;
  for (; (((ulong)local_38 & 3) == 0 && (local_38->tag == 6)); local_38 = (local_38->value).type.cpl
      ) {
    local_40 = sexp_cons_op(ctx,self_00,n_00,(local_38->value).type.name,local_40);
    n_00 = extraout_RDX_00;
  }
  (ctx->value).context.saves = local_28;
  return local_40;
}

Assistant:

sexp sexp_append2_op (sexp ctx, sexp self, sexp_sint_t n, sexp a, sexp b) {
  sexp_gc_var2(a1, b1);
  sexp_gc_preserve2(ctx, a1, b1);
  b1 = b;
  for (a1=sexp_reverse(ctx, a); sexp_pairp(a1); a1=sexp_cdr(a1))
    b1 = sexp_cons(ctx, sexp_car(a1), b1);
  sexp_gc_release2(ctx);
  return b1;
}